

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O0

char * Extra_MmStepEntryFetch(Extra_MmStep_t *p,int nBytes)

{
  int iVar1;
  void *pvVar2;
  void **local_28;
  int nBytes_local;
  Extra_MmStep_t *p_local;
  
  if (nBytes == 0) {
    p_local = (Extra_MmStep_t *)0x0;
  }
  else if (p->nMapSize < nBytes) {
    if (p->nLargeChunks == p->nLargeChunksAlloc) {
      if (p->nLargeChunksAlloc == 0) {
        p->nLargeChunksAlloc = 0x20;
      }
      p->nLargeChunksAlloc = p->nLargeChunksAlloc << 1;
      if (p->pLargeChunks == (void **)0x0) {
        local_28 = (void **)malloc((long)p->nLargeChunksAlloc << 3);
      }
      else {
        local_28 = (void **)realloc(p->pLargeChunks,(long)p->nLargeChunksAlloc << 3);
      }
      p->pLargeChunks = local_28;
    }
    pvVar2 = malloc((long)nBytes);
    iVar1 = p->nLargeChunks;
    p->nLargeChunks = iVar1 + 1;
    p->pLargeChunks[iVar1] = pvVar2;
    p_local = (Extra_MmStep_t *)p->pLargeChunks[p->nLargeChunks + -1];
  }
  else {
    p_local = (Extra_MmStep_t *)Extra_MmFixedEntryFetch(p->pMap[nBytes]);
  }
  return (char *)p_local;
}

Assistant:

char * Extra_MmStepEntryFetch( Extra_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
    if ( nBytes > p->nMapSize )
    {
//        printf( "Allocating %d bytes.\n", nBytes );
//        return ABC_ALLOC( char, nBytes );
        if ( p->nLargeChunks == p->nLargeChunksAlloc )
        {
            if ( p->nLargeChunksAlloc == 0 )
                p->nLargeChunksAlloc = 32;
            p->nLargeChunksAlloc *= 2;
            p->pLargeChunks = ABC_REALLOC( void *, p->pLargeChunks, p->nLargeChunksAlloc );
        }
        p->pLargeChunks[ p->nLargeChunks++ ] = ABC_ALLOC( char, nBytes );
        return (char *)p->pLargeChunks[ p->nLargeChunks - 1 ];
    }
    return Extra_MmFixedEntryFetch( p->pMap[nBytes] );
}